

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O3

void __thiscall
cbtIDebugDraw::drawSphere
          (cbtIDebugDraw *this,cbtScalar radius,cbtTransform *transform,cbtVector3 *color)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  cbtVector3 center;
  cbtVector3 axis;
  cbtVector3 up;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  local_68 = *(undefined8 *)(transform->m_origin).m_floats;
  uStack_60 = *(undefined8 *)((transform->m_origin).m_floats + 2);
  auVar1 = vinsertps_avx(*(undefined1 (*) [16])((transform->m_basis).m_el[0].m_floats + 1),
                         ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[1]),0x10);
  local_38 = vmovlhps_avx(auVar1,ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[1]));
  auVar1 = vinsertps_avx(*(undefined1 (*) [16])(transform->m_basis).m_el[0].m_floats,
                         ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]),0x10);
  local_48 = vmovlhps_avx(auVar1,ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]));
  (*this->_vptr_cbtIDebugDraw[0x12])(this,&local_68,local_38,local_48,color,0);
  auVar1._0_8_ = local_48._0_8_ ^ 0x8000000080000000;
  auVar1._8_4_ = 0x80000000;
  auVar1._12_4_ = 0x80000000;
  auVar2._0_4_ = local_48._8_4_ ^ 0x80000000;
  auVar2._4_4_ = 0x80000000;
  auVar2._8_4_ = 0x80000000;
  auVar2._12_4_ = 0x80000000;
  local_58 = vinsertps_avx(auVar1,auVar2,0x28);
  (*this->_vptr_cbtIDebugDraw[0x12])
            ((ulong)(uint)radius,SUB648(ZEXT464(0xbfc90fdb),0),SUB648(ZEXT464(0x3fc90fdb),0),
             SUB648(ZEXT464(0xbfc90fdb),0),SUB648(ZEXT464(0x3fc90fdb),0),
             SUB648(ZEXT464(0x41f00000),0),this,&local_68,local_38,local_58,color,0);
  return;
}

Assistant:

virtual void drawSphere(cbtScalar radius, const cbtTransform& transform, const cbtVector3& color)
	{
		cbtVector3 center = transform.getOrigin();
		cbtVector3 up = transform.getBasis().getColumn(1);
		cbtVector3 axis = transform.getBasis().getColumn(0);
		cbtScalar minTh = -SIMD_HALF_PI;
		cbtScalar maxTh = SIMD_HALF_PI;
		cbtScalar minPs = -SIMD_HALF_PI;
		cbtScalar maxPs = SIMD_HALF_PI;
		cbtScalar stepDegrees = 30.f;
		drawSpherePatch(center, up, axis, radius, minTh, maxTh, minPs, maxPs, color, stepDegrees, false);
		drawSpherePatch(center, up, -axis, radius, minTh, maxTh, minPs, maxPs, color, stepDegrees, false);
	}